

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

void __thiscall
dxil_spv::SPIRVModule::Impl::emit_leaf_function_body
          (Impl *this,Function *func,CFGStructurizer *structurizer)

{
  Block *pBVar1;
  CFGNode *node;
  CFGStructurizer *structurizer_local;
  Function *func_local;
  Impl *this_local;
  
  this->active_function = func;
  CFGStructurizer::traverse(structurizer,&this->super_BlockEmissionInterface);
  pBVar1 = spv::Function::getEntryBlock(this->active_function);
  spv::Builder::setBuildPoint(&this->builder,pBVar1);
  node = CFGStructurizer::get_entry_block(structurizer);
  pBVar1 = get_spv_block(node);
  spv::Builder::createBranch(&this->builder,pBVar1);
  spv::Builder::leaveFunction(&this->builder);
  this->active_function = (Function *)0x0;
  return;
}

Assistant:

void SPIRVModule::Impl::emit_leaf_function_body(spv::Function *func, CFGStructurizer &structurizer)
{
	active_function = func;
	{
		structurizer.traverse(*this);
		builder.setBuildPoint(active_function->getEntryBlock());
		builder.createBranch(get_spv_block(structurizer.get_entry_block()));
		builder.leaveFunction();
	}
	active_function = nullptr;
}